

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

void ec2NegLD(word *b,word *a,ec_o *ec,void *stack)

{
  long lVar1;
  word *in_RCX;
  long in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *t1;
  size_t n;
  
  lVar1 = *(long *)(*(long *)(in_RDX + 0x18) + 0x30);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (in_RCX,in_RSI,in_RSI + lVar1 * 2,*(undefined8 *)(in_RDX + 0x18),in_RCX + lVar1);
  wwCopy(in_RDI,in_RSI,lVar1 * 3);
  wwXor2(in_RDI + lVar1,in_RCX,*(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  return;
}

Assistant:

static void ec2NegLD(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	stack = t1 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// t1 <- xa * za
	qrMul(t1, ecX(a), ecZ(a, n), ec->f, stack);
	// b <- (xa, ya + t1, za)
	wwCopy(b, a, 3 * n);
	gf2Add2(ecY(b, n), t1, ec->f);
}